

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O1

bool __thiscall TimeOffsets::WarnIfOutOfSync(TimeOffsets *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  Warnings *this_00;
  bilingual_str message;
  seconds sVar4;
  seconds sVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_ffffffffffffff08;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id;
  undefined1 *puVar7;
  undefined8 in_stack_ffffffffffffff18;
  long in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 *puVar8;
  undefined8 in_stack_ffffffffffffff38;
  long in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  bilingual_str local_b0;
  bilingual_str msg;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = Median(this);
  sVar5.__r = 0x8000000000000001;
  if (-0x7fffffffffffffff < sVar4.__r) {
    sVar5 = sVar4;
  }
  uVar6 = -sVar5.__r;
  if (0 < sVar5.__r) {
    uVar6 = sVar5.__r;
  }
  if (uVar6 < 0x259) {
    ::node::Warnings::Unset
              (this->m_warnings,
               (warning_type)
               in_stack_ffffffffffffff08.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
               super__Move_ctor_alias<kernel::Warning,_node::Warning>.
               super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
               super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  }
  else {
    paVar1 = &local_b0.original.field_2;
    local_b0.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
               ,"");
    paVar2 = &local_b0.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_b0.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0.translated,
                 "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
                 ,"");
    }
    else {
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_b0.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                 (char **)&stack0xffffffffffffff08);
    }
    id._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0xa;
    id._M_index = '\0';
    id._5_3_ = 0;
    tinyformat::format<long>(&msg,&local_b0,(long *)&stack0xffffffffffffff08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.translated._M_dataplus._M_p,
                      local_b0.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.original._M_dataplus._M_p,
                      local_b0.original.field_2._M_allocated_capacity + 1);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
    ;
    source_file._M_len = 100;
    logging_function._M_str = "WarnIfOutOfSync";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x3f,ALL,Warning,(ConstevalFormatString<1U>)0x1151304,
               &msg.original);
    this_00 = this->m_warnings;
    puVar7 = &stack0xffffffffffffff20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff10,msg.original._M_dataplus._M_p,
               msg.original._M_dataplus._M_p + msg.original._M_string_length);
    puVar8 = &stack0xffffffffffffff40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff30,msg.translated._M_dataplus._M_p,
               msg.translated._M_dataplus._M_p + msg.translated._M_string_length);
    message.original._M_string_length = in_stack_ffffffffffffff18;
    message.original._M_dataplus._M_p = puVar7;
    message.original.field_2._M_allocated_capacity = in_stack_ffffffffffffff20;
    message.original.field_2._8_8_ = in_stack_ffffffffffffff28;
    message.translated._M_dataplus._M_p = puVar8;
    message.translated._M_string_length = in_stack_ffffffffffffff38;
    message.translated.field_2._M_allocated_capacity = in_stack_ffffffffffffff40;
    message.translated.field_2._8_8_ = in_stack_ffffffffffffff48;
    ::node::Warnings::Set(this_00,(warning_type)id,message);
    if (puVar8 != &stack0xffffffffffffff40) {
      operator_delete(puVar8,in_stack_ffffffffffffff40 + 1);
    }
    if (puVar7 != &stack0xffffffffffffff20) {
      operator_delete(puVar7,in_stack_ffffffffffffff20 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg.translated._M_dataplus._M_p != &msg.translated.field_2) {
      operator_delete(msg.translated._M_dataplus._M_p,
                      msg.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg.original._M_dataplus._M_p != &msg.original.field_2) {
      operator_delete(msg.original._M_dataplus._M_p,msg.original.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return 600 < uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool TimeOffsets::WarnIfOutOfSync() const
{
    // when median == std::numeric_limits<int64_t>::min(), calling std::chrono::abs is UB
    auto median{std::max(Median(), std::chrono::seconds(std::numeric_limits<int64_t>::min() + 1))};
    if (std::chrono::abs(median) <= WARN_THRESHOLD) {
        m_warnings.Unset(node::Warning::CLOCK_OUT_OF_SYNC);
        return false;
    }

    bilingual_str msg{strprintf(_(
        "Your computer's date and time appear to be more than %d minutes out of sync with the network, "
        "this may lead to consensus failure. After you've confirmed your computer's clock, this message "
        "should no longer appear when you restart your node. Without a restart, it should stop showing "
        "automatically after you've connected to a sufficient number of new outbound peers, which may "
        "take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` "
        "RPC methods to get more info."
    ), Ticks<std::chrono::minutes>(WARN_THRESHOLD))};
    LogWarning("%s\n", msg.original);
    m_warnings.Set(node::Warning::CLOCK_OUT_OF_SYNC, msg);
    return true;
}